

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256ByteData256_Test::HashUtil_Sha256ByteData256_Test
          (HashUtil_Sha256ByteData256_Test *this)

{
  HashUtil_Sha256ByteData256_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HashUtil_Sha256ByteData256_Test_009db240;
  return;
}

Assistant:

TEST(HashUtil, Sha256ByteData256) {
  ByteData256 target(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");

  ByteData byte_data2 = (HashUtil("Sha256") << target).Output();
  EXPECT_STREQ(
      byte_data2.GetHex().c_str(),
      "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
}